

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrent_heterogeneous_queue_basic_tests.cpp
# Opt level: O0

void density_tests::conc_heterogeneous_queue_basic_tests(ostream *i_ostream)

{
  undefined1 local_40 [8];
  PrintScopeDuration dur;
  ostream *i_ostream_local;
  
  dur.m_start_time.__d.__r = (duration)(duration)i_ostream;
  PrintScopeDuration::PrintScopeDuration
            ((PrintScopeDuration *)local_40,i_ostream,"concurrent heterogeneous queue basic tests");
  conc_heterogeneous_queue_lifetime_tests();
  conc_heterogeneous_queue_basic_void_tests<density::conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>>
            ();
  conc_heterogeneous_queue_basic_void_tests<density::conc_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>>>
            ();
  conc_heterogeneous_queue_basic_void_tests<density::conc_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<65536ul>>>
            ();
  PrintScopeDuration::~PrintScopeDuration((PrintScopeDuration *)local_40);
  return;
}

Assistant:

void conc_heterogeneous_queue_basic_tests(std::ostream & i_ostream)
    {
        PrintScopeDuration dur(i_ostream, "concurrent heterogeneous queue basic tests");

        conc_heterogeneous_queue_lifetime_tests();

        using namespace density;

        conc_heterogeneous_queue_basic_void_tests<conc_heter_queue<>>();

        conc_heterogeneous_queue_basic_void_tests<
          conc_heter_queue<runtime_type<>, UnmovableFastTestAllocator<>>>();

        conc_heterogeneous_queue_basic_void_tests<
          conc_heter_queue<TestRuntimeTime<>, DeepTestAllocator<>>>();
    }